

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O0

type_conflict2
jsoncons::detail::
encode_base64_generic<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::stream_sink<char>>
          (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           first,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 last,char *alphabet,stream_sink<char> *result)

{
  bool bVar1;
  undefined1 uVar2;
  char cVar3;
  char cVar4;
  reference puVar5;
  long in_RDX;
  int j;
  int i;
  uchar fill;
  uchar a4 [4];
  uchar a3 [3];
  size_t count;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffffc0;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  char cVar9;
  byte in_stack_ffffffffffffffd4;
  byte in_stack_ffffffffffffffd5;
  byte in_stack_ffffffffffffffd6;
  byte in_stack_ffffffffffffffd7;
  type_conflict2 local_28;
  
  local_28 = 0;
  cVar9 = *(char *)(in_RDX + 0x40);
  uVar6 = 0;
  iVar8 = 0;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8),
        bVar1) {
    in_stack_ffffffffffffffc0 =
         __gnu_cxx::
         __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
         ::operator++((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)CONCAT44(iVar8,uVar6),
                      (int)((ulong)in_stack_ffffffffffffffc0._M_current >> 0x20));
    puVar5 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&stack0xffffffffffffffc0);
    iVar7 = iVar8 + 1;
    (&stack0xffffffffffffffd5)[iVar8] = *puVar5;
    iVar8 = iVar7;
    if (iVar7 == 3) {
      uVar2 = (undefined1)((int)(in_stack_ffffffffffffffd5 & 0xfc) >> 2);
      cVar3 = (in_stack_ffffffffffffffd5 & 3) * '\x10' +
              (char)((int)(in_stack_ffffffffffffffd6 & 0xf0) >> 4);
      cVar4 = (in_stack_ffffffffffffffd6 & 0xf) * '\x04' +
              (char)((int)(in_stack_ffffffffffffffd7 & 0xc0) >> 6);
      in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd7 & 0x3f;
      for (iVar8 = 0; iVar8 < 4; iVar8 = iVar8 + 1) {
        stream_sink<char>::push_back
                  ((stream_sink<char> *)
                   CONCAT17(in_stack_ffffffffffffffd7,
                            CONCAT16(in_stack_ffffffffffffffd6,
                                     CONCAT15(in_stack_ffffffffffffffd5,
                                              CONCAT14(in_stack_ffffffffffffffd4,
                                                       CONCAT13(cVar4,CONCAT12(cVar3,CONCAT11(uVar2,
                                                  cVar9))))))),(char)((uint)iVar8 >> 0x18));
        local_28 = local_28 + 1;
      }
      iVar8 = 0;
    }
  }
  iVar7 = iVar8;
  if (0 < iVar8) {
    for (; iVar7 < 3; iVar7 = iVar7 + 1) {
      (&stack0xffffffffffffffd5)[iVar7] = 0;
    }
    uVar2 = (undefined1)((int)(in_stack_ffffffffffffffd5 & 0xfc) >> 2);
    cVar3 = (in_stack_ffffffffffffffd5 & 3) * '\x10' +
            (char)((int)(in_stack_ffffffffffffffd6 & 0xf0) >> 4);
    cVar4 = (in_stack_ffffffffffffffd6 & 0xf) * '\x04' +
            (char)((int)(in_stack_ffffffffffffffd7 & 0xc0) >> 6);
    for (iVar7 = 0; iVar7 < iVar8 + 1; iVar7 = iVar7 + 1) {
      stream_sink<char>::push_back
                ((stream_sink<char> *)
                 CONCAT17(in_stack_ffffffffffffffd7,
                          CONCAT16(in_stack_ffffffffffffffd6,
                                   CONCAT15(in_stack_ffffffffffffffd5,
                                            CONCAT14(in_stack_ffffffffffffffd4,
                                                     CONCAT13(cVar4,CONCAT12(cVar3,CONCAT11(uVar2,
                                                  cVar9))))))),(char)((uint)iVar8 >> 0x18));
      local_28 = local_28 + 1;
    }
    if (cVar9 != '\0') {
      while (iVar7 = iVar8 + 1, iVar8 < 3) {
        stream_sink<char>::push_back
                  ((stream_sink<char> *)
                   CONCAT17(in_stack_ffffffffffffffd7,
                            CONCAT16(in_stack_ffffffffffffffd6,
                                     CONCAT15(in_stack_ffffffffffffffd5,
                                              CONCAT14(in_stack_ffffffffffffffd4,
                                                       CONCAT13(cVar4,CONCAT12(cVar3,CONCAT11(uVar2,
                                                  cVar9))))))),(char)((uint)iVar7 >> 0x18));
        local_28 = local_28 + 1;
        iVar8 = iVar7;
      }
    }
  }
  return local_28;
}

Assistant:

typename std::enable_if<std::is_same<typename std::iterator_traits<InputIt>::value_type,uint8_t>::value,size_t>::type
    encode_base64_generic(InputIt first, InputIt last, const char alphabet[65], Container& result)
    {
        std::size_t count = 0;
        unsigned char a3[3];
        unsigned char a4[4];
        unsigned char fill = alphabet[64];
        int i = 0;
        int j = 0;

        while (first != last)
        {
            a3[i++] = *first++;
            if (i == 3)
            {
                a4[0] = (a3[0] & 0xfc) >> 2;
                a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
                a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);
                a4[3] = a3[2] & 0x3f;

                for (i = 0; i < 4; i++) 
                {
                    result.push_back(alphabet[a4[i]]);
                    ++count;
                }
                i = 0;
            }
        }

        if (i > 0)
        {
            for (j = i; j < 3; ++j) 
            {
                a3[j] = 0;
            }

            a4[0] = (a3[0] & 0xfc) >> 2;
            a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
            a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);

            for (j = 0; j < i + 1; ++j) 
            {
                result.push_back(alphabet[a4[j]]);
                ++count;
            }

            if (fill != 0)
            {
                while (i++ < 3) 
                {
                    result.push_back(fill);
                    ++count;
                }
            }
        }

        return count;
    }